

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Server.cc
# Opt level: O3

void __thiscall Server::~Server(Server *this)

{
  pointer piVar1;
  _Manager_type p_Var2;
  int in_ESI;
  
  close(this,in_ESI);
  piVar1 = (this->_staleFileDescriptors).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar1 != (pointer)0x0) {
    operator_delete(piVar1);
  }
  std::vector<std::shared_ptr<ClientSocket>,_std::allocator<std::shared_ptr<ClientSocket>_>_>::
  ~vector(&this->_clientSockets);
  p_Var2 = (this->_handleRead).super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)((_Any_data *)&this->_handleRead,(_Any_data *)&this->_handleRead,__destroy_functor);
  }
  p_Var2 = (this->_handleAccept).super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)((_Any_data *)&this->_handleAccept,(_Any_data *)&this->_handleAccept,__destroy_functor)
    ;
  }
  return;
}

Assistant:

Server::~Server()
{
  this->close();
}